

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZDICT_tryMerge(dictItem *table,dictItem elt,U32 eltNbToSkip,void *buffer)

{
  dictItem *pdVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 UVar5;
  U32 UVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  U32 UVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  dictItem *pdVar14;
  ulong uVar15;
  char *into;
  long *plVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  
  uVar8 = elt.savings;
  uVar18 = elt._0_8_ >> 0x20;
  uVar9 = (ulong)table->pos;
  uVar17 = elt.pos;
  uVar4 = elt.length;
  uVar11 = uVar17 + uVar4;
  if (1 < uVar9) {
    pdVar14 = table + 1;
    uVar15 = 0;
    do {
      if ((ulong)eltNbToSkip - 1 != uVar15) {
        uVar13 = pdVar14->pos;
        iVar12 = uVar13 - uVar17;
        if (uVar13 <= uVar11 && (uVar17 <= uVar13 && iVar12 != 0)) {
          pdVar14->length = pdVar14->length + iVar12;
          pdVar14->pos = uVar17;
          uVar17 = (uVar4 >> 3) + (int)((uVar8 * iVar12) / uVar18) + pdVar14->savings;
          uVar7 = uVar15 + 1;
          pdVar14->savings = uVar17;
          UVar10 = pdVar14->pos;
          UVar6 = pdVar14->length;
          if (uVar7 < 2) goto LAB_001e5722;
          goto LAB_001e5624;
        }
      }
      uVar15 = uVar15 + 1;
      pdVar14 = pdVar14 + 1;
    } while (uVar9 - 1 != uVar15);
  }
  if (1 < table->pos) {
    plVar16 = (long *)((long)buffer + (ulong)uVar17 + 1);
    pdVar14 = table + 1;
    uVar7 = 1;
    uVar13 = 0;
    do {
      if (uVar7 != eltNbToSkip) {
        pdVar1 = table + uVar7;
        uVar2 = pdVar1->pos;
        uVar3 = pdVar1->length;
        uVar15 = (ulong)uVar3;
        uVar19 = uVar3 + uVar2;
        if (uVar2 < uVar17 && uVar17 <= uVar19) {
          UVar10 = (uVar4 >> 3) + pdVar1->savings;
          pdVar1->savings = UVar10;
          iVar12 = uVar11 - uVar19;
          if (iVar12 != 0 && (int)uVar19 <= (int)uVar11) {
            pdVar1->length = uVar3 + iVar12;
            pdVar1->savings = (int)((uVar8 * iVar12) / uVar18) + UVar10;
          }
          UVar10 = pdVar1->pos;
          UVar6 = pdVar1->length;
          uVar17 = pdVar1->savings;
          if (uVar7 < 2) goto LAB_001e5739;
          goto LAB_001e56a8;
        }
        if (*(long *)((long)buffer + (ulong)uVar2) == *plVar16) {
          if (uVar15 == 0) {
            uVar21 = 0;
          }
          else {
            uVar20 = 0;
            do {
              uVar21 = uVar20;
              if (*(char *)((long)buffer + uVar20 + uVar2) != *(char *)((long)plVar16 + uVar20))
              break;
              uVar20 = uVar20 + 1;
              uVar21 = uVar15;
            } while (uVar15 != uVar20);
          }
          if (uVar21 == uVar15) {
            uVar9 = 1;
            if (1 < (int)(uVar4 - uVar3)) {
              uVar9 = (ulong)(uVar4 - uVar3);
            }
            pdVar1->pos = uVar17;
            pdVar1->savings = pdVar1->savings + (int)((uVar8 * uVar9) / uVar18);
            uVar17 = uVar3 + 1;
            if (uVar4 <= uVar3 + 1) {
              uVar17 = uVar4;
            }
            pdVar1->length = uVar17;
            goto LAB_001e5747;
          }
        }
      }
      uVar7 = uVar7 + 1;
      uVar13 = uVar13 + 1;
      pdVar14 = pdVar14 + 1;
    } while (uVar7 != uVar9);
  }
  uVar7 = 0;
  goto LAB_001e5747;
  while( true ) {
    pdVar1 = table + (uVar15 & 0xffffffff);
    pdVar14->savings = pdVar1->savings;
    UVar5 = pdVar1->length;
    pdVar14->pos = pdVar1->pos;
    pdVar14->length = UVar5;
    pdVar14 = pdVar14 + -1;
    uVar9 = uVar15 & 0xfffffffe;
    uVar15 = uVar15 - 1;
    if (uVar9 == 0) break;
LAB_001e5624:
    if (uVar17 <= table[uVar15 & 0xffffffff].savings) {
      uVar7 = (ulong)((int)uVar15 + 1);
      goto LAB_001e5722;
    }
  }
  uVar7 = 1;
LAB_001e5722:
  table[uVar7 & 0xffffffff].pos = UVar10;
  table[uVar7 & 0xffffffff].length = UVar6;
  table[uVar7 & 0xffffffff].savings = uVar17;
  goto LAB_001e5747;
  while( true ) {
    pdVar1 = table + uVar13;
    pdVar14->savings = pdVar1->savings;
    UVar5 = pdVar1->length;
    pdVar14->pos = pdVar1->pos;
    pdVar14->length = UVar5;
    pdVar14 = pdVar14 + -1;
    uVar4 = uVar13 & 0xfffffffe;
    uVar13 = uVar13 - 1;
    if (uVar4 == 0) break;
LAB_001e56a8:
    if (uVar17 <= table[uVar13].savings) {
      uVar7 = (ulong)(uVar13 + 1);
      goto LAB_001e5739;
    }
  }
  uVar7 = 1;
LAB_001e5739:
  table[uVar7 & 0xffffffff].pos = UVar10;
  table[uVar7 & 0xffffffff].length = UVar6;
  table[uVar7 & 0xffffffff].savings = uVar17;
LAB_001e5747:
  return (U32)uVar7;
}

Assistant:

static U32 ZDICT_tryMerge(dictItem* table, dictItem elt, U32 eltNbToSkip, const void* buffer)
{
    const U32 tableSize = table->pos;
    const U32 eltEnd = elt.pos + elt.length;
    const char* const buf = (const char*) buffer;

    /* tail overlap */
    U32 u; for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;
        if ((table[u].pos > elt.pos) && (table[u].pos <= eltEnd)) {  /* overlap, existing > new */
            /* append */
            U32 const addedLength = table[u].pos - elt.pos;
            table[u].length += addedLength;
            table[u].pos = elt.pos;
            table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            elt = table[u];
            /* sort : improve rank */
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
    }   }

    /* front overlap */
    for (u=1; u<tableSize; u++) {
        if (u==eltNbToSkip) continue;

        if ((table[u].pos + table[u].length >= elt.pos) && (table[u].pos < elt.pos)) {  /* overlap, existing < new */
            /* append */
            int const addedLength = (int)eltEnd - (int)(table[u].pos + table[u].length);
            table[u].savings += elt.length / 8;    /* rough approx bonus */
            if (addedLength > 0) {   /* otherwise, elt fully included into existing */
                table[u].length += addedLength;
                table[u].savings += elt.savings * addedLength / elt.length;   /* rough approx */
            }
            /* sort : improve rank */
            elt = table[u];
            while ((u>1) && (table[u-1].savings < elt.savings))
                table[u] = table[u-1], u--;
            table[u] = elt;
            return u;
        }

        if (MEM_read64(buf + table[u].pos) == MEM_read64(buf + elt.pos + 1)) {
            if (isIncluded(buf + table[u].pos, buf + elt.pos + 1, table[u].length)) {
                size_t const addedLength = MAX( (int)elt.length - (int)table[u].length , 1 );
                table[u].pos = elt.pos;
                table[u].savings += (U32)(elt.savings * addedLength / elt.length);
                table[u].length = MIN(elt.length, table[u].length + 1);
                return u;
            }
        }
    }

    return 0;
}